

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Shader.cpp
# Opt level: O0

void __thiscall sf::Shader::bindTextures(Shader *this)

{
  _func_void_GLint_GLint *p_Var1;
  size_type sVar2;
  pointer ppVar3;
  socklen_t __len;
  ulong uStack_20;
  GLint index;
  size_t i;
  const_iterator it;
  Shader *this_local;
  
  it._M_node = (_Base_ptr)this;
  i = (size_t)std::
              map<int,_const_sf::Texture_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_sf::Texture_*>_>_>
              ::begin(&this->m_textures);
  uStack_20 = 0;
  while( true ) {
    sVar2 = std::
            map<int,_const_sf::Texture_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_sf::Texture_*>_>_>
            ::size(&this->m_textures);
    p_Var1 = sf_ptrc_glUniform1iARB;
    if (sVar2 <= uStack_20) break;
    ppVar3 = std::_Rb_tree_const_iterator<std::pair<const_int,_const_sf::Texture_*>_>::operator->
                       ((_Rb_tree_const_iterator<std::pair<const_int,_const_sf::Texture_*>_> *)&i);
    (*p_Var1)(ppVar3->first,(int)uStack_20 + 1);
    priv::glCheckError("/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/sfml-src/src/SFML/Graphics/Shader.cpp"
                       ,0x3d2,"GLEXT_glUniform1i(it->first, index)");
    (*sf_ptrc_glActiveTextureARB)((int)uStack_20 + 0x84c1);
    priv::glCheckError("/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/sfml-src/src/SFML/Graphics/Shader.cpp"
                       ,0x3d3,"GLEXT_glActiveTexture(GLEXT_GL_TEXTURE0 + index)");
    ppVar3 = std::_Rb_tree_const_iterator<std::pair<const_int,_const_sf::Texture_*>_>::operator->
                       ((_Rb_tree_const_iterator<std::pair<const_int,_const_sf::Texture_*>_> *)&i);
    Texture::bind((int)ppVar3->second,(sockaddr *)0x0,__len);
    std::_Rb_tree_const_iterator<std::pair<const_int,_const_sf::Texture_*>_>::operator++
              ((_Rb_tree_const_iterator<std::pair<const_int,_const_sf::Texture_*>_> *)&i);
    uStack_20 = uStack_20 + 1;
  }
  (*sf_ptrc_glActiveTextureARB)(0x84c0);
  priv::glCheckError("/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/sfml-src/src/SFML/Graphics/Shader.cpp"
                     ,0x3d9,"GLEXT_glActiveTexture(GLEXT_GL_TEXTURE0)");
  return;
}

Assistant:

void Shader::bindTextures() const
{
    TextureTable::const_iterator it = m_textures.begin();
    for (std::size_t i = 0; i < m_textures.size(); ++i)
    {
        GLint index = static_cast<GLsizei>(i + 1);
        glCheck(GLEXT_glUniform1i(it->first, index));
        glCheck(GLEXT_glActiveTexture(GLEXT_GL_TEXTURE0 + index));
        Texture::bind(it->second);
        ++it;
    }

    // Make sure that the texture unit which is left active is the number 0
    glCheck(GLEXT_glActiveTexture(GLEXT_GL_TEXTURE0));
}